

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::alternate_onto(CRegexParser *this,re_machine *dest,re_machine *rhs)

{
  re_state_id rVar1;
  int iVar2;
  re_machine *in_RDX;
  CRegexParser *in_RSI;
  CRegexParser *in_RDI;
  re_machine new_machine;
  re_machine *in_stack_ffffffffffffffe0;
  
  iVar2 = is_machine_null(in_RDI,(re_machine *)in_RSI);
  if (iVar2 == 0) {
    iVar2 = is_machine_null(in_RDI,in_RDX);
    if (iVar2 == 0) {
      build_alter(in_RSI,in_RDX,in_stack_ffffffffffffffe0,(re_machine *)in_RDI);
      *(re_machine **)in_RSI = in_stack_ffffffffffffffe0;
    }
  }
  else {
    rVar1 = in_RDX->final;
    in_RSI->next_state_ = in_RDX->init;
    *(re_state_id *)&in_RSI->field_0x4 = rVar1;
  }
  return;
}

Assistant:

void CRegexParser::alternate_onto(re_machine *dest, re_machine *rhs)
{
    /* check to see if the first machine is null */
    if (is_machine_null(dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first 
         */
        *dest = *rhs;
    }
    else
    {
        /* 
         *   if the second machine is null, don't do anything; otherwise,
         *   build the alternation 
         */
        if (!is_machine_null(rhs))
        {
            re_machine new_machine;
            
            /* build the alternation */
            build_alter(&new_machine, dest, rhs);

            /* replace the first machine with the alternation */
            *dest = new_machine;
        }
    }
}